

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O1

int xmlCharEncCloseFunc(xmlCharEncodingHandler *handler)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  
  if (handler == (xmlCharEncodingHandler *)0x0) {
    return -1;
  }
  if (handler->name == (char *)0x0) {
    return -1;
  }
  if ((handlers != (xmlCharEncodingHandlerPtr *)0x0) && (0 < (long)nbCharEncodingHandler)) {
    uVar3 = 0;
    lVar4 = 0;
    do {
      if (handlers[lVar4] == handler) {
        bVar1 = true;
        goto LAB_00145dd4;
      }
      lVar4 = lVar4 + 1;
    } while (nbCharEncodingHandler != lVar4);
  }
  if (handler->iconv_out == (iconv_t)0x0) {
    if (handler->iconv_in == (iconv_t)0x0) {
      bVar1 = true;
      uVar3 = 0;
      goto LAB_00145dd4;
    }
    uVar3 = 0;
  }
  else {
    iVar2 = iconv_close(handler->iconv_out);
    uVar3 = -(uint)(iVar2 != 0);
    handler->iconv_out = (iconv_t)0x0;
  }
  bVar1 = false;
  if (handler->iconv_in != (iconv_t)0x0) {
    iVar2 = iconv_close(handler->iconv_in);
    uVar3 = -(uint)(iVar2 != 0) | uVar3;
    handler->iconv_in = (iconv_t)0x0;
  }
LAB_00145dd4:
  if (!bVar1) {
    if (handler->name != (char *)0x0) {
      (*xmlFree)(handler->name);
    }
    handler->name = (char *)0x0;
    (*xmlFree)(handler);
  }
  return uVar3;
}

Assistant:

int
xmlCharEncCloseFunc(xmlCharEncodingHandler *handler) {
    int ret = 0;
    int tofree = 0;
    int i, handler_in_list = 0;

    if (handler == NULL) return(-1);
    if (handler->name == NULL) return(-1);
    if (handlers != NULL) {
        for (i = 0;i < nbCharEncodingHandler; i++) {
            if (handler == handlers[i]) {
	        handler_in_list = 1;
		break;
	    }
	}
    }
#ifdef LIBXML_ICONV_ENABLED
    /*
     * Iconv handlers can be used only once, free the whole block.
     * and the associated icon resources.
     */
    if ((handler_in_list == 0) &&
        ((handler->iconv_out != NULL) || (handler->iconv_in != NULL))) {
        tofree = 1;
	if (handler->iconv_out != NULL) {
	    if (iconv_close(handler->iconv_out))
		ret = -1;
	    handler->iconv_out = NULL;
	}
	if (handler->iconv_in != NULL) {
	    if (iconv_close(handler->iconv_in))
		ret = -1;
	    handler->iconv_in = NULL;
	}
    }
#endif /* LIBXML_ICONV_ENABLED */
#ifdef LIBXML_ICU_ENABLED
    if ((handler_in_list == 0) &&
        ((handler->uconv_out != NULL) || (handler->uconv_in != NULL))) {
        tofree = 1;
	if (handler->uconv_out != NULL) {
	    closeIcuConverter(handler->uconv_out);
	    handler->uconv_out = NULL;
	}
	if (handler->uconv_in != NULL) {
	    closeIcuConverter(handler->uconv_in);
	    handler->uconv_in = NULL;
	}
    }
#endif
    if (tofree) {
        /* free up only dynamic handlers iconv/uconv */
        if (handler->name != NULL)
            xmlFree(handler->name);
        handler->name = NULL;
        xmlFree(handler);
    }
#ifdef DEBUG_ENCODING
    if (ret)
        xmlGenericError(xmlGenericErrorContext,
		"failed to close the encoding handler\n");
    else
        xmlGenericError(xmlGenericErrorContext,
		"closed the encoding handler\n");
#endif

    return(ret);
}